

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_secrets.cpp
# Opt level: O2

char * duckdb::TryGetEnv(char *name)

{
  char *pcVar1;
  allocator local_51;
  string local_50;
  string local_30;
  
  pcVar1 = getenv(name);
  if (pcVar1 == (char *)0x0) {
    ::std::__cxx11::string::string((string *)&local_50,name,&local_51);
    StringUtil::Upper(&local_30,&local_50);
    pcVar1 = getenv(local_30._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return pcVar1;
}

Assistant:

static const char *TryGetEnv(const char *name) {
	const char *res = std::getenv(name);
	if (res) {
		return res;
	}
	return std::getenv(StringUtil::Upper(name).c_str());
}